

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

NodeRef<typename_KeyParser::Key> __thiscall
miniscript::FromScript<(anonymous_namespace)::KeyParser>
          (miniscript *this,CScript *script,KeyParser *ctx)

{
  pointer ptVar1;
  long lVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var4;
  pointer puVar5;
  pointer puVar6;
  SigningProvider *pSVar7;
  pointer pvVar8;
  pointer pvVar9;
  Node<unsigned_int> *this_00;
  uint uVar10;
  pointer ppVar11;
  pointer psVar12;
  array<unsigned_char,_20UL> *paVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  uint32_t uVar17;
  uint uVar18;
  int iVar19;
  ParseScriptContext ctx_00;
  opcodetype oVar20;
  _Storage<long,_true> _Var21;
  ulong uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  int i;
  long lVar24;
  pointer ppVar25;
  Fragment nt;
  long lVar26;
  element_type *peVar27;
  undefined8 uVar28;
  long in_FS_OFFSET;
  optional<long> oVar29;
  NodeRef<typename_KeyParser::Key> NVar30;
  pointer *local_1c0;
  _Storage<long,_true> local_198;
  NodeRef<unsigned_int> ret;
  undefined1 local_174 [12];
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  constructed;
  vector<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
  to_parse;
  optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  decomposed;
  undefined1 local_108 [16];
  optional<unsigned_int> key_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  _Head_base<2UL,_long,_false> local_e8;
  ulong uStack_e0;
  ulong local_d8;
  CPubKey pubkey;
  optional<unsigned_int> key;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  uchar local_68 [16];
  uint160 hash;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar18 = (script->super_CScriptBase)._size;
  uVar10 = uVar18 - 0x1d;
  if (uVar18 < 0x1d) {
    uVar10 = uVar18;
  }
  uVar17 = internal::MaxScriptSize(ctx->m_script_ctx);
  if (uVar17 < uVar10) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_0031e434;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var23._M_pi = extraout_RDX;
    goto LAB_0031dfb5;
  }
  internal::DecomposeScript(&decomposed,script);
  uVar14 = decomposed.
           super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           ._M_payload._M_value.
           super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (decomposed.
      super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_engaged != false) {
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    constructed.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    constructed.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    constructed.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pubkey.vch[0] = '\x01';
    pubkey.vch[1] = '\0';
    pubkey.vch[2] = '\0';
    pubkey.vch[3] = '\0';
    local_e8._M_head_impl._0_4_ = 0xffffffff;
    hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
    hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
    hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
    hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
    std::
    vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
    ::emplace_back<miniscript::internal::DecodeContext,int,int>
              ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                *)&to_parse,(DecodeContext *)&pubkey,(int *)&local_e8,(int *)&hash);
    uVar28 = decomposed.
             super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
switchD_0031c41c_default:
    if (to_parse.
        super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        to_parse.
        super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar15 = pubkey.vch._0_8_;
      if ((long)constructed.
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)constructed.
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) goto LAB_0031df29;
      this_00 = ((constructed.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      pubkey.vch._8_8_ =
           ((constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      ((constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      pubkey.vch._0_8_ = this_00;
      Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(this_00,ctx);
      bVar16 = Node<unsigned_int>::IsValidTopLevel(this_00);
      if (bVar16) {
        ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)pubkey.vch._0_8_;
        ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pubkey.vch._8_8_;
        pubkey.vch[0] = '\0';
        pubkey.vch[1] = '\0';
        pubkey.vch[2] = '\0';
        pubkey.vch[3] = '\0';
        pubkey.vch[4] = '\0';
        pubkey.vch[5] = '\0';
        pubkey.vch[6] = '\0';
        pubkey.vch[7] = '\0';
        pubkey.vch[8] = '\0';
        pubkey.vch[9] = '\0';
        pubkey.vch[10] = '\0';
        pubkey.vch[0xb] = '\0';
        pubkey.vch[0xc] = '\0';
        pubkey.vch[0xd] = '\0';
        pubkey.vch[0xe] = '\0';
        pubkey.vch[0xf] = '\0';
      }
      else {
        ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      peVar27 = ret.
                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pubkey.vch + 8));
      goto LAB_0031df34;
    }
    if ((constructed.
         super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         constructed.
         super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar16 = Node<unsigned_int>::IsValid
                           (constructed.
                            super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].
                            super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr), uVar15 = pubkey.vch._0_8_, !bVar16)) goto LAB_0031df29;
    ptVar1 = to_parse.
             super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_d8 = *(ulong *)&to_parse.
                          super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super__Tuple_impl<0UL,_miniscript::internal::DecodeContext,_long,_long>.
                          super__Head_base<0UL,_miniscript::internal::DecodeContext,_false>;
    local_e8._M_head_impl =
         to_parse.
         super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Tuple_impl<0UL,_miniscript::internal::DecodeContext,_long,_long>.
         super__Tuple_impl<1UL,_long,_long>.super__Tuple_impl<2UL,_long>.
         super__Head_base<2UL,_long,_false>._M_head_impl;
    uStack_e0 = to_parse.
                super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Tuple_impl<0UL,_miniscript::internal::DecodeContext,_long,_long>.
                super__Tuple_impl<1UL,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ptVar1;
    uVar15 = pubkey.vch._0_8_;
    switch(local_d8 & 0xffffffff) {
    case 0:
      if ((ulong)uVar14 <= (ulong)uVar28) break;
      oVar20 = ((pointer)uVar28)->first;
      if (oVar20 == OP_0) {
        hash.super_base_blob<160U>.m_data._M_elems._0_4_ = ctx->m_script_ctx;
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             ((ulong)(uint)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_int>._4_4_ << 0x20);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment>
                  ((NoDupCheck *)&pubkey,(MiniscriptContext *)&key_2,(Fragment *)&hash);
        std::
        vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
LAB_0031cf75:
        uVar28 = uVar28 + 0x20;
LAB_0031cf79:
        paVar13 = (array<unsigned_char,_20UL> *)&pubkey;
        goto LAB_0031cf81;
      }
      if (oVar20 == OP_1) {
        hash.super_base_blob<160U>.m_data._M_elems._0_4_ = ctx->m_script_ctx;
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 1;
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment>
                  ((NoDupCheck *)&pubkey,(MiniscriptContext *)&key_2,(Fragment *)&hash);
        std::
        vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
        goto LAB_0031cf75;
      }
      _Var3._M_current =
           (((pointer)uVar28)->second).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var4._M_current =
           (((pointer)uVar28)->second).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (((long)_Var4._M_current - (long)_Var3._M_current & 0xfffffffffffffffeU) == 0x20) {
        key = (anonymous_namespace)::KeyParser::
              FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((KeyParser *)ctx,_Var3,_Var4);
        uVar15 = pubkey.vch._0_8_;
        if (((ulong)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) break;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        local_108._0_4_ = 2;
        Vector<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey,(uint *)&key);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)(local_174 + 8),(Fragment *)&key_2,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
        std::
        vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&hash);
        uVar28 = uVar28 + 0x20;
LAB_0031d01c:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (hash.super_base_blob<160U>.m_data._M_elems + 8));
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey);
        goto switchD_0031c41c_default;
      }
      lVar26 = uVar14 - uVar28;
      lVar24 = lVar26 >> 5;
      if (lVar24 < 5) {
        hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (ulong)(uint7)hash.super_base_blob<160U>.m_data._M_elems._9_7_ << 8;
        if ((lVar24 < 2) || (oVar20 != OP_CHECKSEQUENCEVERIFY)) {
          if (0x20 < lVar26) goto LAB_0031d3cf;
          goto LAB_0031d489;
        }
LAB_0031d313:
        oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + 0x20));
        uVar15 = pubkey.vch._0_8_;
        hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        hash.super_base_blob<160U>.m_data._M_elems._13_3_ = pubkey.vch._4_3_;
        hash.super_base_blob<160U>.m_data._M_elems[9] = pubkey.vch[0];
        hash.super_base_blob<160U>.m_data._M_elems[10] = pubkey.vch[1];
        hash.super_base_blob<160U>.m_data._M_elems[0xb] = pubkey.vch[2];
        hash.super_base_blob<160U>.m_data._M_elems[0xc] = pubkey.vch[3];
        hash.super_base_blob<160U>.m_data._M_elems[8] =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        pubkey.vch._0_8_ = uVar15;
        if (((undefined1  [16])
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0031d3cf;
        uVar28 = uVar28 + 0x40;
        if (hash.super_base_blob<160U>.m_data._M_elems._0_8_ - 0x80000000 < 0xffffffff80000001)
        break;
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 4;
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,long&>
                  ((NoDupCheck *)&pubkey,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (long *)&key_2);
        std::
        vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
        goto LAB_0031cf79;
      }
      if (oVar20 == OP_VERIFY) {
        if (((((pointer)(uVar28 + 0x20))->first == OP_EQUAL) &&
            (((pointer)(uVar28 + 0x60))->first == OP_HASH160)) &&
           (((pointer)(uVar28 + 0x80))->first == OP_DUP)) {
          puVar5 = (((pointer)(uVar28 + 0x40))->second).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar6 = (((pointer)(uVar28 + 0x40))->second).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((long)puVar6 - (long)puVar5 == 0x14) {
            pSVar7 = ctx->m_in;
            if (pSVar7 == (SigningProvider *)0x0) {
              __assert_fail("m_in",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                            ,0x6ca,
                            "std::optional<Key> (anonymous namespace)::KeyParser::FromPKHBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                           );
            }
            hash.super_base_blob<160U>.m_data._M_elems[0] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[4] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[5] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[6] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[7] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[8] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[9] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[10] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
            hash.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
            if (puVar6 != puVar5) {
              hash.super_base_blob<160U>.m_data._M_elems._16_4_ = *(undefined4 *)(puVar5 + 0x10);
              hash.super_base_blob<160U>.m_data._M_elems._0_8_ = *(undefined8 *)puVar5;
              hash.super_base_blob<160U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar5 + 8);
            }
            local_68[0] = hash.super_base_blob<160U>.m_data._M_elems[0x10];
            local_68[1] = hash.super_base_blob<160U>.m_data._M_elems[0x11];
            local_68[2] = hash.super_base_blob<160U>.m_data._M_elems[0x12];
            local_68[3] = hash.super_base_blob<160U>.m_data._M_elems[0x13];
            key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int> =
                 (_Optional_base<unsigned_int,_true,_true>)
                 (_Optional_base<unsigned_int,_true,_true>)
                 hash.super_base_blob<160U>.m_data._M_elems._0_8_;
            _Stack_70._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 hash.super_base_blob<160U>.m_data._M_elems._8_8_;
            pubkey.vch[0] = 0xff;
            iVar19 = (*pSVar7->_vptr_SigningProvider[4])(pSVar7,&key,(NoDupCheck *)&pubkey);
            uVar15 = pubkey.vch._0_8_;
            if ((char)iVar19 != '\0') {
              ctx_00 = anon_unknown.dwarf_ea566c::KeyParser::ParseContext(ctx);
              anon_unknown.dwarf_ea566c::InferPubkey
                        ((anon_unknown_dwarf_ea566c *)&key_2,&pubkey,ctx_00,ctx->m_in);
              uVar15 = pubkey.vch._0_8_;
              if (key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> !=
                  (_Optional_payload<unsigned_int,_true,_true,_true>)0x0) {
                pvVar8 = (ctx->m_keys).
                         super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pvVar9 = (ctx->m_keys).
                         super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                std::
                vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                ::emplace_back<>(&ctx->m_keys);
                std::
                vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                ::
                emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                          ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                            *)((ctx->m_keys).
                               super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -1),
                           (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                            *)&key_2);
                if (key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> !=
                    (_Optional_payload<unsigned_int,_true,_true,_true>)0x0) {
                  (**(code **)(*(long *)key_2.super__Optional_base<unsigned_int,_true,_true>.
                                        _M_payload.super__Optional_payload_base<unsigned_int> + 8))
                            ();
                }
                local_108._0_8_ = ((long)pvVar8 - (long)pvVar9) / 0x18 & 0xffffffffU | 0x100000000;
                key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload =
                     (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
                key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload._M_value = 3;
                Vector<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey,
                           (uint *)local_108);
                std::
                make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          ((NoDupCheck *)&hash,(MiniscriptContext *)(local_174 + 8),(Fragment *)&key
                           ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&key_2);
                std::
                vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                          ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                            *)&constructed,
                           (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&hash);
                uVar28 = uVar28 + 0xa0;
                goto LAB_0031d01c;
              }
            }
            break;
          }
        }
        hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (ulong)(uint7)hash.super_base_blob<160U>.m_data._M_elems._9_7_ << 8;
      }
      else {
        hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (ulong)(uint7)hash.super_base_blob<160U>.m_data._M_elems._9_7_ << 8;
        if (oVar20 == OP_CHECKSEQUENCEVERIFY) goto LAB_0031d313;
      }
LAB_0031d3cf:
      if (((pointer)uVar28)->first == OP_CHECKLOCKTIMEVERIFY) {
        oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + 0x20));
        uVar15 = pubkey.vch._0_8_;
        hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        hash.super_base_blob<160U>.m_data._M_elems._13_3_ = pubkey.vch._4_3_;
        hash.super_base_blob<160U>.m_data._M_elems[9] = pubkey.vch[0];
        hash.super_base_blob<160U>.m_data._M_elems[10] = pubkey.vch[1];
        hash.super_base_blob<160U>.m_data._M_elems[0xb] = pubkey.vch[2];
        hash.super_base_blob<160U>.m_data._M_elems[0xc] = pubkey.vch[3];
        hash.super_base_blob<160U>.m_data._M_elems[8] =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        pubkey.vch._0_8_ = uVar15;
        if (((undefined1  [16])
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          uVar28 = uVar28 + 0x40;
          if (hash.super_base_blob<160U>.m_data._M_elems._0_8_ - 0x80000000 < 0xffffffff80000001)
          break;
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload =
               (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 5;
          std::
          make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,long&>
                    ((NoDupCheck *)&pubkey,(MiniscriptContext *)local_108,(Fragment *)&key,
                     (long *)&key_2);
          std::
          vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                    ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                      *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
          goto LAB_0031cf79;
        }
      }
LAB_0031d489:
      if (lVar26 < 0xc1) {
        oVar20 = ((pointer)uVar28)->first;
        if (0x40 < lVar26) goto LAB_0031d6fc;
        bVar16 = false;
LAB_0031d81a:
        if (oVar20 == OP_VERIFY) {
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          pubkey.vch[0] = '\a';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
          pubkey.vch._0_8_ = (ulong)(uint)pubkey.vch._4_4_ << 0x20;
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
        }
        else if (oVar20 == OP_0NOTEQUAL) {
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          pubkey.vch[0] = '\t';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
          pubkey.vch._0_8_ = (ulong)(uint)pubkey.vch._4_4_ << 0x20;
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
        }
        else {
          if (oVar20 != OP_CHECKSIG) {
            if (bVar16 && oVar20 == OP_EQUAL) {
              oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + 0x20));
              uVar15 = pubkey.vch._0_8_;
              hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
                   oVar29.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
              hash.super_base_blob<160U>.m_data._M_elems._13_3_ = pubkey.vch._4_3_;
              hash.super_base_blob<160U>.m_data._M_elems[9] = pubkey.vch[0];
              hash.super_base_blob<160U>.m_data._M_elems[10] = pubkey.vch[1];
              hash.super_base_blob<160U>.m_data._M_elems[0xb] = pubkey.vch[2];
              hash.super_base_blob<160U>.m_data._M_elems[0xc] = pubkey.vch[3];
              hash.super_base_blob<160U>.m_data._M_elems[8] =
                   oVar29.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_engaged;
              if (((undefined1  [16])
                   oVar29.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long> & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0) {
                if (0 < (long)hash.super_base_blob<160U>.m_data._M_elems._0_8_) {
                  pubkey.vch._4_4_ = SUB84(uVar15,4);
                  pubkey.vch[0] = '\x11';
                  pubkey.vch[1] = '\0';
                  pubkey.vch[2] = '\0';
                  pubkey.vch[3] = '\0';
                  key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> =
                       (_Optional_base<unsigned_int,_true,_true>)
                       ((ulong)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_int> & 0xffffffff00000000);
                  std::
                  vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                  ::emplace_back<miniscript::internal::DecodeContext,int,long&>
                            ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                              *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(long *)&hash);
                  goto LAB_0031d0c3;
                }
                break;
              }
              oVar20 = ((pointer)uVar28)->first;
              pubkey.vch._0_8_ = uVar15;
            }
            if (oVar20 == OP_BOOLOR) {
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              pubkey.vch[0] = '\x0e';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
              pubkey.vch[0] = '\0';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              pubkey.vch[0] = '\x02';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
            }
            else if (oVar20 == OP_BOOLAND) {
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              pubkey.vch[0] = '\f';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
              pubkey.vch[0] = '\0';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              pubkey.vch[0] = '\x02';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
            }
            else {
              uVar15 = pubkey.vch._0_8_;
              if (oVar20 != OP_ENDIF) break;
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              pubkey.vch[0] = '\x13';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              pubkey.vch[0] = '\x01';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
            }
            goto LAB_0031d067;
          }
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          pubkey.vch[0] = '\x05';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
          pubkey.vch._0_8_ = (ulong)(uint)pubkey.vch._4_4_ << 0x20;
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&key,(int *)&key_2);
        }
        goto LAB_0031cf1b;
      }
      if (((((pointer)uVar28)->first == OP_EQUAL) &&
          (((pointer)(uVar28 + 0x60))->first == OP_VERIFY)) &&
         (((pointer)(uVar28 + 0x80))->first == OP_EQUAL)) {
        oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + 0xa0));
        uVar15 = pubkey.vch._0_8_;
        hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        hash.super_base_blob<160U>.m_data._M_elems._13_3_ = pubkey.vch._4_3_;
        hash.super_base_blob<160U>.m_data._M_elems[9] = pubkey.vch[0];
        hash.super_base_blob<160U>.m_data._M_elems[10] = pubkey.vch[1];
        hash.super_base_blob<160U>.m_data._M_elems[0xb] = pubkey.vch[2];
        hash.super_base_blob<160U>.m_data._M_elems[0xc] = pubkey.vch[3];
        hash.super_base_blob<160U>.m_data._M_elems[8] =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        pubkey.vch._0_8_ = uVar15;
        if (((hash.super_base_blob<160U>.m_data._M_elems._0_8_ == 0x20 &
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged) == 1) &&
           (((pointer)(uVar28 + 0xc0))->first == OP_SIZE)) {
          switch(((pointer)(uVar28 + 0x40))->first) {
          case OP_RIPEMD160:
            if ((long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x14) {
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload =
                   (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 8;
              std::
              make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&pubkey,(MiniscriptContext *)local_108,(Fragment *)&key,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key_2);
              std::
              vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                        ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                          *)&constructed,
                         (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
LAB_0031d6d5:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pubkey.vch + 8));
              uVar28 = uVar28 + 0xe0;
              goto switchD_0031c41c_default;
            }
            break;
          case OP_SHA256:
            if ((long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x20) {
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload =
                   (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 6;
              std::
              make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&pubkey,(MiniscriptContext *)local_108,(Fragment *)&key,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key_2);
              std::
              vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                        ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                          *)&constructed,
                         (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
              goto LAB_0031d6d5;
            }
            break;
          case OP_HASH160:
            if ((long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x14) {
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload =
                   (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 9;
              std::
              make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&pubkey,(MiniscriptContext *)local_108,(Fragment *)&key,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key_2);
              std::
              vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                        ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                          *)&constructed,
                         (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
              goto LAB_0031d6d5;
            }
            break;
          case OP_HASH256:
            if ((long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(((pointer)(uVar28 + 0x20))->second).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x20) {
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload =
                   (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
              key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 7;
              std::
              make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&pubkey,(MiniscriptContext *)local_108,(Fragment *)&key,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key_2);
              std::
              vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                        ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                          *)&constructed,
                         (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&pubkey);
              goto LAB_0031d6d5;
            }
          }
        }
      }
      oVar20 = ((pointer)uVar28)->first;
LAB_0031d6fc:
      if (oVar20 == OP_CHECKMULTISIG) {
        bVar16 = IsTapscript(ctx->m_script_ctx);
        uVar15 = pubkey.vch._0_8_;
        if (bVar16) break;
        pubkey.vch[0] = '\0';
        pubkey.vch[1] = '\0';
        pubkey.vch[2] = '\0';
        pubkey.vch[3] = '\0';
        pubkey.vch[4] = '\0';
        pubkey.vch[5] = '\0';
        pubkey.vch[6] = '\0';
        pubkey.vch[7] = '\0';
        pubkey.vch[8] = '\0';
        pubkey.vch[9] = '\0';
        pubkey.vch[10] = '\0';
        pubkey.vch[0xb] = '\0';
        pubkey.vch[0xc] = '\0';
        pubkey.vch[0xd] = '\0';
        pubkey.vch[0xe] = '\0';
        pubkey.vch[0xf] = '\0';
        pubkey.vch[0x10] = '\0';
        pubkey.vch[0x11] = '\0';
        pubkey.vch[0x12] = '\0';
        pubkey.vch[0x13] = '\0';
        pubkey.vch[0x14] = '\0';
        pubkey.vch[0x15] = '\0';
        pubkey.vch[0x16] = '\0';
        pubkey.vch[0x17] = '\0';
        oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + 0x20));
        _Var21._M_value =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        if (((((undefined1  [16])
               oVar29.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            || (lVar24 < (long)(_Var21._M_value + 3U))) ||
           (_Var21._M_value - 0x15U < 0xffffffffffffffec)) {
LAB_0031d768:
          ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1c0._0_4_ = 1;
        }
        else {
          local_1c0 = &(((pointer)(uVar28 + 0x40))->second).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          local_198._M_value = _Var21._M_value;
          while (bVar16 = local_198._M_value != 0, local_198._M_value = local_198._M_value - 1,
                bVar16) {
            if (((long)*local_1c0 - (long)((_Vector_impl_data *)(local_1c0 + -1))->_M_start != 0x21)
               || (key = (anonymous_namespace)::KeyParser::
                         FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                   ((KeyParser *)ctx,
                                    (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     )((_Vector_impl_data *)(local_1c0 + -1))->_M_start,
                                    (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     )*local_1c0),
                  ((ulong)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) == 0))
            goto LAB_0031d768;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey,(uint *)&key);
            local_1c0 = local_1c0 + 4;
          }
          oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + (_Var21._M_value + 2) * 0x20));
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               oVar29.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          _Stack_70._M_pi._0_1_ =
               oVar29.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
          if (((((undefined1  [16])
                 oVar29.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) ||
              ((long)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int> < 1)) ||
             ((ulong)_Var21 <
              (ulong)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>)) goto LAB_0031d768;
          std::
          __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (pubkey.vch._0_8_,pubkey.vch._8_8_);
          local_108._0_4_ = ctx->m_script_ctx;
          local_174._8_4_ = 0x19;
          std::
          make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_int,std::allocator<unsigned_int>>,long_const&>
                    ((NoDupCheck *)&key_2,(MiniscriptContext *)local_174,(Fragment *)local_108,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_174 + 8),
                     (long *)&pubkey);
          std::
          vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                    ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                      *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&key_2);
          uVar28 = uVar28 + (_Var21._M_value + 3U) * 0x20;
LAB_0031de11:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
          local_1c0._0_4_ = 4;
        }
LAB_0031d777:
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey);
      }
      else {
        bVar16 = true;
        if ((lVar26 == 0x60) || (oVar20 != OP_NUMEQUAL)) goto LAB_0031d81a;
        bVar16 = IsTapscript(ctx->m_script_ctx);
        uVar15 = pubkey.vch._0_8_;
        if (!bVar16) break;
        oVar29 = internal::ParseScriptNumber((Opcode *)(uVar28 + 0x20));
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        _Stack_70._M_pi._0_1_ =
             oVar29.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        if (((((undefined1  [16])
               oVar29.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            && (0xfffffffffffffc18 <
                (long)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> - 1000U)) &&
           ((long)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> * 2 + 2 <= lVar24)) {
          pubkey.vch[0] = '\0';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          pubkey.vch[4] = '\0';
          pubkey.vch[5] = '\0';
          pubkey.vch[6] = '\0';
          pubkey.vch[7] = '\0';
          pubkey.vch[8] = '\0';
          pubkey.vch[9] = '\0';
          pubkey.vch[10] = '\0';
          pubkey.vch[0xb] = '\0';
          pubkey.vch[0xc] = '\0';
          pubkey.vch[0xd] = '\0';
          pubkey.vch[0xe] = '\0';
          pubkey.vch[0xf] = '\0';
          pubkey.vch[0x10] = '\0';
          pubkey.vch[0x11] = '\0';
          pubkey.vch[0x12] = '\0';
          pubkey.vch[0x13] = '\0';
          pubkey.vch[0x14] = '\0';
          pubkey.vch[0x15] = '\0';
          pubkey.vch[0x16] = '\0';
          pubkey.vch[0x17] = '\0';
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey,
                     (size_type)
                     key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>);
          lVar26 = 2;
          ppVar11 = (pointer)uVar28;
          do {
            ppVar25 = ppVar11 + 2;
            lVar26 = lVar26 + 2;
            if ((lVar24 < lVar26) ||
               ((ppVar25->first != OP_CHECKSIG && (ppVar25->first != OP_CHECKSIGADD))))
            goto LAB_0031d768;
            _Var3._M_current =
                 ppVar11[3].second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var4._M_current =
                 ppVar11[3].second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (((long)_Var4._M_current - (long)_Var3._M_current != 0x20) ||
               (key_2 = (anonymous_namespace)::KeyParser::
                        FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  ((KeyParser *)ctx,_Var3,_Var4),
               ((ulong)key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0x100000000) == 0))
            goto LAB_0031d768;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pubkey,(uint *)&key_2
                      );
            uVar22 = pubkey.vch._8_8_ - pubkey.vch._0_8_;
            if (0xf9c < uVar22) goto LAB_0031d768;
            ppVar11 = ppVar25;
          } while (ppVar25->first != OP_CHECKSIG);
          if ((ulong)key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int> <= uVar22 >> 2) {
            std::
            __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      ();
            local_108._0_4_ = ctx->m_script_ctx;
            local_174._8_4_ = 0x1a;
            std::
            make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_int,std::allocator<unsigned_int>>,long_const&>
                      ((NoDupCheck *)&key_2,(MiniscriptContext *)local_174,(Fragment *)local_108,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_174 + 8),
                       (long *)&pubkey);
            std::
            vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
            ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                      ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                        *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&key_2);
            uVar28 = uVar28 + uVar22 * 0x10 + 0x40;
            goto LAB_0031de11;
          }
          ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1c0._0_4_ = 1;
          goto LAB_0031d777;
        }
        ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1c0._0_4_ = 1;
      }
      peVar27 = ret.
                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if ((int)local_1c0 != 4) goto LAB_0031df34;
      goto switchD_0031c41c_default;
    case 1:
      hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
      hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
      hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
      hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
      pubkey.vch[0] = '\n';
      pubkey.vch[1] = '\0';
      pubkey.vch[2] = '\0';
      pubkey.vch[3] = '\0';
      key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
      std::
      vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
      ::emplace_back<miniscript::internal::DecodeContext,int,int>
                ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                  *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
      pubkey.vch._0_8_ = (ulong)(uint)pubkey.vch._4_4_ << 0x20;
      hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
      hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
      hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
      hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
      key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
      std::
      vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
      ::emplace_back<miniscript::internal::DecodeContext,int,int>
                ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                  *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
      goto switchD_0031c41c_default;
    case 2:
      if ((ulong)uVar28 < (ulong)uVar14) {
        if (((pointer)uVar28)->first == OP_FROMALTSTACK) {
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          pubkey.vch[0] = '\x04';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
          uVar28 = uVar28 + 0x20;
        }
        else {
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          pubkey.vch[0] = '\x03';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
        }
        hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
        pubkey.vch[0] = '\x01';
        pubkey.vch[1] = '\0';
        pubkey.vch[2] = '\0';
        pubkey.vch[3] = '\0';
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
        goto switchD_0031c41c_default;
      }
      break;
    case 3:
      if ((((ulong)uVar28 < (ulong)uVar14) && (((pointer)uVar28)->first == OP_SWAP)) &&
         (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xb;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
LAB_0031c69f:
        uVar28 = uVar28 + 0x20;
LAB_0031cc05:
        std::__shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>::
        operator=(&constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                  ,(__shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2> *
                   )&hash);
LAB_0031cc16:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (hash.super_base_blob<160U>.m_data._M_elems + 8));
        std::
        vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ::~vector((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   *)&pubkey);
        goto switchD_0031c41c_default;
      }
      break;
    case 4:
      if ((((ulong)uVar28 < (ulong)uVar14) && (((pointer)uVar28)->first == OP_TOALTSTACK)) &&
         (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 10;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
        goto LAB_0031c69f;
      }
      break;
    case 5:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xc;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
        goto LAB_0031cc05;
      }
      break;
    case 6:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xd;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
        goto LAB_0031cc05;
      }
      break;
    case 7:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xe;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
        goto LAB_0031cc05;
      }
      break;
    case 8:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xf;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
        goto LAB_0031cc05;
      }
      break;
    case 9:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0x10;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,
                   constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2);
        goto LAB_0031cc05;
      }
      break;
    case 10:
      if (((ulong)uVar28 < (ulong)uVar14) &&
         ((uVar18 = ((pointer)uVar28)->first - OP_IF, 0x19 < uVar18 ||
          ((0x2000113U >> (uVar18 & 0x1f) & 1) == 0)))) {
        hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
        pubkey.vch[0] = '\v';
        pubkey.vch[1] = '\0';
        pubkey.vch[2] = '\0';
        pubkey.vch[3] = '\0';
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
        hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
        pubkey.vch[0] = '\x01';
        pubkey.vch[1] = '\0';
        pubkey.vch[2] = '\0';
        pubkey.vch[3] = '\0';
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
      }
      goto switchD_0031c41c_default;
    case 0xb:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = AND_V;
LAB_0031c619:
        internal::BuildBack<unsigned_int>(ctx->m_script_ctx,nt,&constructed,true);
        goto switchD_0031c41c_default;
      }
      break;
    case 0xc:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = AND_B;
        goto LAB_0031c619;
      }
      break;
    case 0xd:
      if (0x20 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        psVar12 = constructed.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar12->
                    super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
        psVar12 = constructed.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        _Stack_70._M_pi =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar12->
                    super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        _Stack_f0._M_pi =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        local_174._8_4_ = ctx->m_script_ctx;
        local_174._0_4_ = 0x17;
        Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::shared_ptr<miniscript::Node<unsigned_int>const>,std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&pubkey,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&hash,
                   (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&key_2,
                   (shared_ptr<const_miniscript::Node<unsigned_int>_> *)&key);
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
                  ((NoDupCheck *)local_108,(MiniscriptContext *)(local_174 + 7),
                   (Fragment *)(local_174 + 8),
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)local_174);
        std::__shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>::
        operator=(&constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                  ,(__shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2> *
                   )local_108);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
        std::
        vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
        ::~vector((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   *)&pubkey);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
        paVar13 = &hash.super_base_blob<160U>.m_data;
LAB_0031cf81:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(paVar13->_M_elems + 8));
        goto switchD_0031c41c_default;
      }
      break;
    case 0xe:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = OR_B;
        goto LAB_0031c619;
      }
      break;
    case 0xf:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = OR_C;
        goto LAB_0031c619;
      }
      break;
    case 0x10:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = OR_D;
        goto LAB_0031c619;
      }
      break;
    case 0x11:
      if ((ulong)uVar28 < (ulong)uVar14) {
        if (((pointer)uVar28)->first == OP_ADD) {
          hash.super_base_blob<160U>.m_data._M_elems[0] = '\x11';
          hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
          hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
          hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
          pubkey.vch._0_8_ = uStack_e0 + 1;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,long,long&>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&hash,(long *)&pubkey,&local_e8._M_head_impl);
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          pubkey.vch[0] = '\x02';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
LAB_0031d067:
          uVar28 = uVar28 + 0x20;
        }
        else {
          hash.super_base_blob<160U>.m_data._M_elems[0] = '\x12';
          hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
          hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
          hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
          pubkey.vch._0_8_ = uStack_e0 + 1;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,long,long&>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&hash,(long *)&pubkey,&local_e8._M_head_impl);
          pubkey.vch._0_8_ = pubkey.vch._0_8_ & 0xffffffff00000000;
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
        }
        goto switchD_0031c41c_default;
      }
      break;
    case 0x12:
      if (((0 < local_e8._M_head_impl) && (local_e8._M_head_impl <= (long)uStack_e0)) &&
         (uStack_e0 <=
          (ulong)((long)constructed.
                        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)constructed.
                        super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4))) {
        pubkey.vch[0] = '\0';
        pubkey.vch[1] = '\0';
        pubkey.vch[2] = '\0';
        pubkey.vch[3] = '\0';
        pubkey.vch[4] = '\0';
        pubkey.vch[5] = '\0';
        pubkey.vch[6] = '\0';
        pubkey.vch[7] = '\0';
        pubkey.vch[8] = '\0';
        pubkey.vch[9] = '\0';
        pubkey.vch[10] = '\0';
        pubkey.vch[0xb] = '\0';
        pubkey.vch[0xc] = '\0';
        pubkey.vch[0xd] = '\0';
        pubkey.vch[0xe] = '\0';
        pubkey.vch[0xf] = '\0';
        pubkey.vch[0x10] = '\0';
        pubkey.vch[0x11] = '\0';
        pubkey.vch[0x12] = '\0';
        pubkey.vch[0x13] = '\0';
        pubkey.vch[0x14] = '\0';
        pubkey.vch[0x15] = '\0';
        pubkey.vch[0x16] = '\0';
        pubkey.vch[0x17] = '\0';
        for (lVar24 = 0; lVar24 < (long)uStack_e0; lVar24 = lVar24 + 1) {
          psVar12 = constructed.
                    super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
               constructed.
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
               constructed.
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               constructed.
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&(psVar12->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount);
          std::
          vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                    ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                      *)&pubkey,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&hash);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     (hash.super_base_blob<160U>.m_data._M_elems + 8));
        }
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(_Storage<unsigned_int,_true>)ctx->m_script_ctx;
        key_2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0x18;
        std::
        make_shared<miniscript::Node<unsigned_int>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>,long&>
                  ((NoDupCheck *)&hash,(MiniscriptContext *)local_108,(Fragment *)&key,
                   (vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                    *)&key_2,(long *)&pubkey);
        std::
        vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<unsigned_int>_> *)&hash);
        goto LAB_0031cc16;
      }
      break;
    case 0x13:
      if ((ulong)uVar28 < (ulong)uVar14) {
        oVar20 = ((pointer)uVar28)->first;
        if (oVar20 == OP_IF) {
          if (0x20 < (long)(uVar14 - uVar28)) {
            if (((pointer)(uVar28 + 0x20))->first == OP_DUP) {
              hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
              hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
              hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
              hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
              pubkey.vch[0] = '\x06';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
LAB_0031d0c3:
              uVar28 = uVar28 + 0x40;
              goto switchD_0031c41c_default;
            }
            if (((uVar14 - uVar28 != 0x40) && (((pointer)(uVar28 + 0x20))->first == OP_0NOTEQUAL))
               && (((pointer)(uVar28 + 0x40))->first == OP_SIZE)) {
              hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
              hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
              hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
              hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
              pubkey.vch[0] = '\b';
              pubkey.vch[1] = '\0';
              pubkey.vch[2] = '\0';
              pubkey.vch[3] = '\0';
              key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
              uVar28 = uVar28 + 0x60;
              goto switchD_0031c41c_default;
            }
          }
        }
        else {
          if (oVar20 == OP_NOTIF) {
            hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
            pubkey.vch[0] = '\x14';
            pubkey.vch[1] = '\0';
            pubkey.vch[2] = '\0';
            pubkey.vch[3] = '\0';
            key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
            goto LAB_0031d067;
          }
          if (oVar20 == OP_ELSE) {
            hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
            pubkey.vch[0] = '\x15';
            pubkey.vch[1] = '\0';
            pubkey.vch[2] = '\0';
            pubkey.vch[3] = '\0';
            key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
            hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
            hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
            pubkey.vch[0] = '\x01';
            pubkey.vch[1] = '\0';
            pubkey.vch[2] = '\0';
            pubkey.vch[3] = '\0';
            key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
            uVar28 = uVar28 + 0x20;
            goto switchD_0031c41c_default;
          }
        }
      }
      break;
    case 0x14:
      if ((ulong)uVar28 < (ulong)uVar14) {
        if (((pointer)uVar28)->first == OP_IFDUP) {
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          pubkey.vch[0] = '\x10';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
          uVar28 = uVar28 + 0x20;
        }
        else {
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          pubkey.vch[0] = '\x0f';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
        }
        pubkey.vch._0_8_ = pubkey.vch._0_8_ & 0xffffffff00000000;
        hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
        hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
        key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
        goto switchD_0031c41c_default;
      }
      break;
    case 0x15:
      if ((ulong)uVar28 < (ulong)uVar14) {
        if (((pointer)uVar28)->first == OP_NOTIF) {
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          pubkey.vch[0] = '\r';
          pubkey.vch[1] = '\0';
          pubkey.vch[2] = '\0';
          pubkey.vch[3] = '\0';
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
          pubkey.vch._0_8_ = (ulong)(uint)pubkey.vch._4_4_ << 0x20;
          hash.super_base_blob<160U>.m_data._M_elems[0] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[1] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[2] = 0xff;
          hash.super_base_blob<160U>.m_data._M_elems[3] = 0xff;
          key.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&pubkey,(int *)&hash,(int *)&key);
LAB_0031cf1b:
          uVar28 = uVar28 + 0x20;
          goto switchD_0031c41c_default;
        }
        if (((pointer)uVar28)->first == OP_IF) {
          uVar28 = uVar28 + 0x20;
          nt = OR_I;
          goto LAB_0031c619;
        }
      }
      break;
    default:
      goto switchD_0031c41c_default;
    }
LAB_0031df29:
    pubkey.vch._0_8_ = uVar15;
    ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar27 = (element_type *)0x0;
    goto LAB_0031df34;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  goto LAB_0031df91;
LAB_0031df34:
  std::
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  ::~vector(&constructed);
  std::
  _Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
  ::~_Vector_base(&to_parse.
                   super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
                 );
  _Var23 = ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
  if ((peVar27 == (element_type *)0x0) ||
     ((pointer)uVar28 !=
      decomposed.
      super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(element_type **)this = peVar27;
    ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var23._M_pi;
    ret.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_0031df91:
  std::
  _Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              *)&decomposed);
  _Var23._M_pi = extraout_RDX_00;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_0031e434:
    __stack_chk_fail();
  }
LAB_0031dfb5:
  NVar30.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var23._M_pi;
  NVar30.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (NodeRef<typename_KeyParser::Key>)
         NVar30.super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline NodeRef<typename Ctx::Key> FromScript(const CScript& script, const Ctx& ctx) {
    using namespace internal;
    // A too large Script is necessarily invalid, don't bother parsing it.
    if (script.size() > MaxScriptSize(ctx.MsContext())) return {};
    auto decomposed = DecomposeScript(script);
    if (!decomposed) return {};
    auto it = decomposed->begin();
    auto ret = DecodeScript<typename Ctx::Key>(it, decomposed->end(), ctx);
    if (!ret) return {};
    if (it != decomposed->end()) return {};
    return ret;
}